

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

int pztopology::TPZPrism::SideNodeLocId(int side,int node)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  char local_19;
  
  iVar1 = side;
  if (5 < side || node != 0) {
    if (node < 2 && side - 6U < 9) {
      iVar1 = SideNodes[side - 6U][node];
    }
    else {
      if (side == 0xf) {
        if (node < 3) {
          return FaceNodes[0][node];
        }
        if (node == 3) {
          return -1;
        }
      }
      if (node < 4 && side - 0x10U < 3) {
        iVar1 = FaceNodes[side - 0xf][node];
      }
      else {
        if (side == 0x13) {
          if (node < 3) {
            return FaceNodes[4][node];
          }
          if (node == 3) {
            return -1;
          }
        }
        iVar1 = node;
        if (side != 0x14 || 5 < node) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZPrism::SideNodeLocId inconsistent side or node ",0x32
                    );
          poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,side);
          local_19 = ' ';
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
          plVar3 = (long *)std::ostream::operator<<(poVar2,node);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          iVar1 = -1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int TPZPrism::SideNodeLocId(int side, int node)
	{
		if(side<6 && node == 0) return side;
		if(side>= 6 && side < 15 && node<2) return SideNodes[side-6][node];
		if(side==15) {
			if(node < 3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; //previsto para faces triangulares
		}
		if(side>15 && side <19 && node <4) return FaceNodes[side-15][node];
		if(side==19) {
			if(node<3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; // Previsto p/ faces triangulares
        }
		
		if(side==20 && node<6) return node;
		PZError << "TPZPrism::SideNodeLocId inconsistent side or node " << side << ' ' << node << endl;
		return -1;
	}